

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLiSample> * __thiscall
pbrt::PortalImageInfiniteLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,PortalImageInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  ulong extraout_XMM0_Qb;
  ulong uVar12;
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar15 [56];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Vector3f VVar19;
  SampledSpectrum SVar20;
  float local_74;
  Tuple3<pbrt::Point3,_float> local_70;
  optional<pbrt::Bounds2<float>_> local_64;
  Tuple2<pbrt::Point2,_float> local_50;
  undefined8 local_48;
  ulong uStack_40;
  Tuple2<pbrt::Point2,_float> local_38;
  ulong uStack_30;
  undefined1 local_28 [16];
  
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_50 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar10._0_16_);
  auVar5 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar9._0_4_ = ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                 high + auVar5._0_4_;
  auVar9._4_4_ = ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                 low + auVar5._4_4_;
  auVar9._8_4_ = auVar5._8_4_ + 0.0;
  auVar9._12_4_ = auVar5._12_4_ + 0.0;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  local_28 = vmulps_avx512vl(auVar9,auVar5);
  fVar6 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
          0.5;
  local_70._0_8_ = vmovlps_avx(local_28);
  local_70.z = fVar6;
  ImageBounds(&local_64,this,(Point3f *)&local_70);
  if (local_64.set != false) {
    local_38 = (Tuple2<pbrt::Point2,_float>)
               WindowedPiecewiseConstant2D::Sample
                         (&this->distribution,(Point2f *)&local_50,(Bounds2f *)&local_64,&local_70.x
                         );
    if ((local_70.x != 0.0) || (NAN(local_70.x))) {
      uVar12 = extraout_XMM0_Qb;
      uStack_30 = extraout_XMM0_Qb;
      VVar19 = RenderFromImage(this,(Point2f)local_38,&local_74);
      local_48 = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      if ((local_74 != 0.0) || (NAN(local_74))) {
        auVar15 = (undefined1  [56])0x0;
        fVar8 = local_70.x / local_74;
        if (ABS(fVar8) != INFINITY) {
          auVar13 = ZEXT856(uStack_30);
          uStack_40 = uVar12;
          SVar20 = ImageLookup(this,(Point2f)local_38,&lambda);
          auVar14._0_8_ = SVar20.values.values._8_8_;
          auVar14._8_56_ = auVar15;
          auVar11._0_8_ = SVar20.values.values._0_8_;
          auVar11._8_56_ = auVar13;
          fVar2 = this->sceneRadius + this->sceneRadius;
          auVar7._8_8_ = uStack_40;
          auVar7._0_8_ = local_48;
          auVar5 = vmovshdup_avx(auVar7);
          fVar3 = local_28._0_4_ + (float)local_48 * fVar2;
          auVar9 = vmovshdup_avx(local_28);
          fVar4 = auVar9._0_4_ + auVar5._0_4_ * fVar2;
          fVar6 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z * fVar2 + fVar6;
          auVar17._4_4_ = fVar3;
          auVar17._0_4_ = fVar3;
          auVar17._8_4_ = fVar3;
          auVar17._12_4_ = fVar3;
          auVar18._4_4_ = fVar4;
          auVar18._0_4_ = fVar4;
          auVar18._8_4_ = fVar4;
          auVar18._12_4_ = fVar4;
          auVar5 = vmovlhps_avx(auVar17,auVar18);
          auVar16._4_4_ = fVar6;
          auVar16._0_4_ = fVar6;
          auVar16._8_4_ = fVar6;
          auVar16._12_4_ = fVar6;
          *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) =
               ZEXT432(0) << 0x20;
          *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
          __return_storage_ptr__->set = true;
          auVar9 = vmovlhps_avx(auVar11._0_16_,auVar14._0_16_);
          *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar9;
          uVar1 = vmovlps_avx(auVar7);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
               VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar8;
          *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar5;
          uVar1 = vmovlps_avx(auVar16);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
          *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
               &(this->super_LightBase).mediumInterface;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
          return __return_storage_ptr__;
        }
        LogFatal<char_const(&)[12]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
                   ,0x482,"Check failed: %s",(char (*) [12])"!IsInf(pdf)");
      }
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> PortalImageInfiniteLight::SampleLi(
    LightSampleContext ctx, Point2f u, SampledWavelengths lambda,
    LightSamplingMode mode) const {
    // Sample $(u,v)$ in potentially-visible region of light image
    pstd::optional<Bounds2f> b = ImageBounds(ctx.p());
    if (!b)
        return {};
    Float mapPDF;
    Point2f uv = distribution.Sample(u, *b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert portal image sample point to direction and compute PDF
    Float duv_dw;
    Vector3f wi = RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};
    Float pdf = mapPDF / duv_dw;
    CHECK(!IsInf(pdf));

    // Compute radiance for portal light sample and return _LightLiSample_
    SampledSpectrum L = ImageLookup(uv, lambda);
    Point3f pl = ctx.p() + 2 * sceneRadius * wi;
    return LightLiSample(L, wi, pdf, Interaction(pl, &mediumInterface));
}